

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arenas_lookup_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  rtree_ctx_t *ctx;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  size_t __n;
  rtree_ctx_t local_1b0;
  
  iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    uVar11 = 0;
  }
  else {
    iVar6 = 0x16;
    if (newlen != 8) goto LAB_01165110;
    uVar11 = *newp;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar8 = uVar11 & 0xffffffffc0000000;
  uVar9 = (ulong)(((uint)(uVar11 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar9);
  uVar9 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar9);
  if (uVar9 == uVar8) {
    prVar12 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar11 >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar8) {
    prVar12 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar9;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar8;
    puVar1[1] = (ulong)prVar12;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)uVar11 >> 9 & 0x1ffff8));
  }
  else {
    lVar10 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar10 + -8) == uVar8) {
        uVar4 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar10);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar10 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar10 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(ulong *)((long)ctx->cache + lVar10 + -0x18) = uVar9;
        *(ulong *)((long)(ctx->cache + -1) + lVar10) = puVar1[1];
        *puVar1 = uVar8;
        puVar1[1] = uVar4;
        prVar12 = (rtree_leaf_elm_t *)(((uint)uVar11 >> 9 & 0x1ffff8) + uVar4);
        goto LAB_011650af;
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x188);
    prVar12 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,uVar11,false,false);
  }
LAB_011650af:
  if (prVar12 == (rtree_leaf_elm_t *)0x0) {
    iVar6 = 0x16;
  }
  else {
    iVar6 = 0x16;
    puVar7 = (uint *)(((long)(prVar12->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
    if ((puVar7 != (uint *)0x0) && (duckdb_je_arenas[*puVar7 & 0xfff].repr != (void *)0x0)) {
      local_1b0.cache[0].leafkey._0_4_ =
           *(undefined4 *)((long)duckdb_je_arenas[*puVar7 & 0xfff].repr + 0x13468);
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar11 = *oldlenp;
        if (uVar11 != 4) {
          __n = 4;
          if (uVar11 < 4) {
            __n = uVar11;
          }
          switchD_00b03519::default(oldp,&local_1b0,__n);
          *oldlenp = __n;
          goto LAB_01165110;
        }
        *(undefined4 *)oldp = (undefined4)local_1b0.cache[0].leafkey;
      }
      iVar6 = 0;
    }
  }
LAB_01165110:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar6;
}

Assistant:

static int
arenas_lookup_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	void *ptr;
	emap_full_alloc_ctx_t alloc_ctx;
	bool ptr_not_present;
	arena_t *arena;

	ptr = NULL;
	ret = EINVAL;
	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(ptr, void *);
	ptr_not_present = emap_full_alloc_ctx_try_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		&alloc_ctx);
	if (ptr_not_present || alloc_ctx.edata == NULL) {
		goto label_return;
	}

	arena = arena_get_from_edata(alloc_ctx.edata);
	if (arena == NULL) {
		goto label_return;
	}

	arena_ind = arena_ind_get(arena);
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}